

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters_tests.c
# Opt level: O0

void can_strip_multiple_mixed_parameters_to_leave_original_names(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  names = (CgreenVector *)create_vector_of_names("box_double(a), d(b), c, d,e,box_double(f),d(g)");
  uVar1 = cgreen_vector_get(names,0);
  uVar2 = create_equal_to_string_constraint("a","\"a\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x74,"(const char *)cgreen_vector_get(names, 0)",uVar1,uVar2);
  uVar1 = cgreen_vector_get(names,1);
  uVar2 = create_equal_to_string_constraint("b","\"b\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x75,"(const char *)cgreen_vector_get(names, 1)",uVar1,uVar2);
  uVar1 = cgreen_vector_get(names,2);
  uVar2 = create_equal_to_string_constraint("c","\"c\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x76,"(const char *)cgreen_vector_get(names, 2)",uVar1,uVar2);
  uVar1 = cgreen_vector_get(names,3);
  uVar2 = create_equal_to_string_constraint("d","\"d\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x77,"(const char *)cgreen_vector_get(names, 3)",uVar1,uVar2);
  uVar1 = cgreen_vector_get(names,4);
  uVar2 = create_equal_to_string_constraint("e","\"e\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x78,"(const char *)cgreen_vector_get(names, 4)",uVar1,uVar2);
  uVar1 = cgreen_vector_get(names,5);
  uVar2 = create_equal_to_string_constraint("f","\"f\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x79,"(const char *)cgreen_vector_get(names, 5)",uVar1,uVar2);
  uVar1 = cgreen_vector_get(names,6);
  uVar2 = create_equal_to_string_constraint("g","\"g\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x7a,"(const char *)cgreen_vector_get(names, 6)",uVar1,uVar2);
  return;
}

Assistant:

Ensure(can_strip_multiple_mixed_parameters_to_leave_original_names) {
    names = create_vector_of_names("box_double(a), d(b), c, d,e,box_double(f),d(g)");
    assert_that((const char *)cgreen_vector_get(names, 0), is_equal_to_string("a"));
    assert_that((const char *)cgreen_vector_get(names, 1), is_equal_to_string("b"));
    assert_that((const char *)cgreen_vector_get(names, 2), is_equal_to_string("c"));
    assert_that((const char *)cgreen_vector_get(names, 3), is_equal_to_string("d"));
    assert_that((const char *)cgreen_vector_get(names, 4), is_equal_to_string("e"));
    assert_that((const char *)cgreen_vector_get(names, 5), is_equal_to_string("f"));
    assert_that((const char *)cgreen_vector_get(names, 6), is_equal_to_string("g"));
}